

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_page_operator.c
# Opt level: O0

HPDF_STATUS HPDF_Page_MoveTextPos2(HPDF_Page page,HPDF_REAL x,HPDF_REAL y)

{
  void *pvVar1;
  char *eptr_00;
  char *pcVar2;
  HPDF_STATUS HVar3;
  HPDF_PageAttr attr;
  char *eptr;
  char *pbuf;
  char buf [512];
  HPDF_STATUS ret;
  HPDF_REAL y_local;
  HPDF_REAL x_local;
  HPDF_Page page_local;
  
  buf._504_8_ = HPDF_Page_CheckState(page,4);
  eptr_00 = buf + 0x1f7;
  page_local = (HPDF_Page)buf._504_8_;
  if ((HPDF_Page)buf._504_8_ == (HPDF_Page)0x0) {
    pvVar1 = page->attr;
    HPDF_MemSet(&pbuf,'\0',0x200);
    pcVar2 = HPDF_FToA((char *)&pbuf,x,eptr_00);
    *pcVar2 = ' ';
    pcVar2 = HPDF_FToA(pcVar2 + 1,y,eptr_00);
    HPDF_StrCpy(pcVar2," TD\n",eptr_00);
    HVar3 = HPDF_Stream_WriteStr(*(HPDF_Stream *)((long)pvVar1 + 0x70),(char *)&pbuf);
    if (HVar3 == 0) {
      *(float *)((long)pvVar1 + 0x58) =
           x * *(float *)((long)pvVar1 + 0x48) + y * *(float *)((long)pvVar1 + 0x50) +
           *(float *)((long)pvVar1 + 0x58);
      *(float *)((long)pvVar1 + 0x5c) =
           y * *(float *)((long)pvVar1 + 0x54) + x * *(float *)((long)pvVar1 + 0x4c) +
           *(float *)((long)pvVar1 + 0x5c);
      *(undefined4 *)((long)pvVar1 + 0x40) = *(undefined4 *)((long)pvVar1 + 0x58);
      *(undefined4 *)((long)pvVar1 + 0x44) = *(undefined4 *)((long)pvVar1 + 0x5c);
      *(float *)(*(long *)((long)pvVar1 + 0x28) + 0x60) = -y;
      page_local = (HPDF_Page)buf._504_8_;
    }
    else {
      page_local = (HPDF_Page)HPDF_CheckError(page->error);
    }
  }
  return (HPDF_STATUS)page_local;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_Page_MoveTextPos2  (HPDF_Page  page,
                         HPDF_REAL  x,
                         HPDF_REAL  y)
{
    HPDF_STATUS ret = HPDF_Page_CheckState (page, HPDF_GMODE_TEXT_OBJECT);
    char buf[HPDF_TMP_BUF_SIZ];
    char *pbuf = buf;
    char *eptr = buf + HPDF_TMP_BUF_SIZ - 1;
    HPDF_PageAttr attr;

    HPDF_PTRACE ((" HPDF_Page_MoveTextPos2\n"));

    if (ret != HPDF_OK)
        return ret;

    attr = (HPDF_PageAttr)page->attr;

    HPDF_MemSet (buf, 0, HPDF_TMP_BUF_SIZ);

    pbuf = HPDF_FToA (pbuf, x, eptr);
    *pbuf++ = ' ';
    pbuf = HPDF_FToA (pbuf, y, eptr);
    HPDF_StrCpy (pbuf, " TD\012", eptr);

    if (HPDF_Stream_WriteStr (attr->stream, buf) != HPDF_OK)
        return HPDF_CheckError (page->error);

    attr->text_matrix.x += x * attr->text_matrix.a + y * attr->text_matrix.c;
    attr->text_matrix.y += y * attr->text_matrix.d + x * attr->text_matrix.b;
    attr->text_pos.x = attr->text_matrix.x;
    attr->text_pos.y = attr->text_matrix.y;
    attr->gstate->text_leading = -y;

    return ret;
}